

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-ni.c
# Opt level: O0

void sha1_ni_write(BinarySink *bs,void *vp,size_t len)

{
  _Bool _Var1;
  sha1_ni *s;
  size_t len_local;
  void *vp_local;
  BinarySink *bs_local;
  
  s = (sha1_ni *)len;
  len_local = (size_t)vp;
  vp_local = bs;
  while (s != (sha1_ni *)0x0) {
    _Var1 = sha1_block_write((sha1_block *)&bs[-4].writefmtv,(void **)&len_local,(size_t *)&s);
    if (_Var1) {
      sha1_ni_block((__m128i *)(bs + -5),(uint8_t *)&bs[-4].writefmtv);
    }
  }
  return;
}

Assistant:

static void sha1_ni_write(BinarySink *bs, const void *vp, size_t len)
{
    sha1_ni *s = BinarySink_DOWNCAST(bs, sha1_ni);

    while (len > 0)
        if (sha1_block_write(&s->blk, &vp, &len))
            sha1_ni_block(s->core, s->blk.block);
}